

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O2

void __thiscall DatabaseConfig::set(DatabaseConfig *this,ConfigKey *key,uint64_t value)

{
  json_value jVar1;
  reference pvVar2;
  runtime_error *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20;
  
  if ((key->min_ <= value) && (value <= key->max_)) {
    local_20.m_type = number_unsigned;
    local_20.m_value = (json_value)value;
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&this->config_,&key->key_);
    local_20.m_type = pvVar2->m_type;
    pvVar2->m_type = number_unsigned;
    jVar1 = pvVar2->m_value;
    (pvVar2->m_value).number_unsigned = (number_unsigned_t)local_20.m_value;
    local_20.m_value = jVar1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_20);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Tried to set config to invalid value");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool DatabaseConfig::can_set(const ConfigKey &key, uint64_t value) const {
    if (value < key.min()) {
        return false;
    }
    if (value > key.max()) {
        return false;
    }
    return true;
}